

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineBlendTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::BlendTest::createInstance(BlendTest *this,Context *context)

{
  Context **__s;
  Context **ppCVar1;
  Context **ppCVar2;
  TestInstance *pTVar3;
  TestInstance *pTVar4;
  TestInstance *pTVar5;
  TestInstance *pTVar6;
  float *pfVar7;
  VkPipelineShaderStageCreateFlags *pVVar8;
  VkFormat VVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  void *pvVar12;
  undefined8 uVar13;
  VkAttachmentDescription *pVVar14;
  VkShaderModule VVar15;
  VkDevice pVVar16;
  VkCommandPool VVar17;
  Handle<(vk::HandleType)18> HVar18;
  DeviceInterface *pDVar19;
  VkAllocationCallbacks *pVVar20;
  bool bVar21;
  VkResult VVar22;
  TestInstance *pTVar23;
  DeviceInterface *vk;
  VkDevice device;
  InstanceInterface *pIVar24;
  VkPhysicalDevice pVVar25;
  const_iterator cVar26;
  NotSupportedError *this_00;
  long *plVar27;
  long lVar28;
  ulong uVar29;
  size_type *psVar30;
  Context *pCVar31;
  VkPipelineColorBlendAttachmentState *pVVar32;
  Context *pCVar33;
  TestInstance *pTVar34;
  Context **ppCVar35;
  long lVar36;
  _func_int **pp_Var37;
  byte bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  deUint32 queueFamilyIndex;
  VkRenderPassCreateInfo renderPassParams;
  VkPipelineShaderStageCreateInfo shaderStages [2];
  undefined1 local_638 [16];
  VkDevice local_628;
  VkCommandPool VStack_620;
  VkPipelineColorBlendAttachmentState *local_618;
  float local_610 [4];
  Context **local_600;
  Context **local_5f8;
  Context **local_5f0;
  Move<vk::Handle<(vk::HandleType)18>_> local_5e8;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentReference local_5c0;
  VkPipelineRasterizationStateCreateInfo rasterStateParams;
  VkFormatProperties formatProps;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  undefined8 local_518;
  Context *pCStack_510;
  undefined8 uStack_508;
  undefined8 uStack_500;
  VkPipelineRasterizationStateCreateInfo *pVStack_4f8;
  VkPipelineMultisampleStateCreateInfo *local_4f0;
  VkPipelineDepthStencilStateCreateInfo *local_4e8;
  VkPipelineColorBlendStateCreateInfo *local_4e0;
  VkPipelineDynamicStateCreateInfo *local_4d8;
  VkPipelineLayout local_4d0;
  VkRenderPass local_4c8;
  deUint32 local_4c0;
  VkPipeline local_4b8;
  deUint32 local_4b0;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkViewport local_2e0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo multisampleStateParams;
  SimpleAllocator memAlloc;
  
  bVar38 = 0;
  pTVar23 = (TestInstance *)operator_new(0x310);
  VVar9 = this->m_colorFormat;
  pTVar23->m_context = context;
  pTVar23->_vptr_TestInstance = (_func_int **)&PTR__BlendTestInstance_00d27588;
  pTVar23[9]._vptr_TestInstance = (_func_int **)0x2000000020;
  *(VkFormat *)&pTVar23[9].m_context = VVar9;
  ppCVar35 = &pTVar23[0xf].m_context;
  __s = &pTVar23[0x12].m_context;
  local_5f0 = &pTVar23[0x14].m_context;
  local_5f8 = &pTVar23[0x16].m_context;
  local_600 = &pTVar23[0x18].m_context;
  ppCVar1 = &pTVar23[0x1a].m_context;
  ppCVar2 = &pTVar23[0x1c].m_context;
  pTVar3 = pTVar23 + 0x21;
  pTVar4 = pTVar23 + 0x2b;
  pTVar5 = pTVar23 + 0x2d;
  pTVar6 = pTVar23 + 0x2f;
  pTVar23[0x10].m_context = (Context *)0x0;
  pTVar23[0x11]._vptr_TestInstance = (_func_int **)0x0;
  pTVar23[0xf].m_context = (Context *)0x0;
  pTVar23[0x10]._vptr_TestInstance = (_func_int **)0x0;
  pTVar23[0x11].m_context = (Context *)0x0;
  memset(__s,0,0xe0);
  memset(pTVar3,0,0x100);
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(pTVar23->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pTVar23->m_context);
  pIVar24 = Context::getInstanceInterface(pTVar23->m_context);
  pVVar25 = Context::getPhysicalDevice(pTVar23->m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&formatProps,pIVar24,pVVar25);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&formatProps);
  pVVar32 = this->m_blendStates;
  pTVar34 = pTVar23 + 1;
  for (lVar28 = 0x20; lVar28 != 0; lVar28 = lVar28 + -1) {
    *(VkBool32 *)&pTVar34->_vptr_TestInstance = pVVar32->blendEnable;
    pVVar32 = (VkPipelineColorBlendAttachmentState *)((long)pVVar32 + (ulong)bVar38 * -8 + 4);
    pTVar34 = (TestInstance *)((long)pTVar34 + (ulong)bVar38 * -8 + 4);
  }
  pIVar24 = Context::getInstanceInterface(context);
  pVVar25 = Context::getPhysicalDevice(context);
  (*pIVar24->_vptr_InstanceInterface[3])
            (pIVar24,pVVar25,(ulong)*(uint *)&pTVar23[9].m_context,&formatProps);
  if ((~formatProps.optimalTilingFeatures & 0x180) != 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    renderPassParams._0_8_ = &renderPassParams.flags;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&renderPassParams,"Unsupported color blending format: ","");
    ::vk::getFormatName(*(VkFormat *)&pTVar23[9].m_context);
    plVar27 = (long *)std::__cxx11::string::append((char *)&renderPassParams);
    formatProps._0_8_ = *plVar27;
    psVar30 = (size_type *)(plVar27 + 2);
    if ((size_type *)formatProps._0_8_ == psVar30) {
      local_528._M_allocated_capacity = *psVar30;
      local_528._8_8_ = plVar27[3];
      formatProps._0_8_ = &local_528;
    }
    else {
      local_528._M_allocated_capacity = *psVar30;
    }
    unique0x00012000 = (Context *)plVar27[1];
    *plVar27 = (long)psVar30;
    plVar27[1] = 0;
    *(undefined1 *)(plVar27 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&formatProps);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  uVar10 = *(undefined4 *)&pTVar23[9].m_context;
  *(undefined4 *)&pTVar23[10]._vptr_TestInstance = 0xe;
  pTVar23[10].m_context = (Context *)0x0;
  pTVar23[0xb]._vptr_TestInstance = (_func_int **)0x100000000;
  *(undefined4 *)&pTVar23[0xb].m_context = uVar10;
  *(_func_int ***)((long)&pTVar23[0xb].m_context + 4) = pTVar23[9]._vptr_TestInstance;
  *(undefined8 *)((long)&pTVar23[0xc]._vptr_TestInstance + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar23[0xc].m_context + 4) = 0x100000001;
  *(undefined8 *)((long)&pTVar23[0xd]._vptr_TestInstance + 4) = 0x1100000000;
  *(undefined8 *)((long)&pTVar23[0xd].m_context + 4) = 0x100000000;
  pTVar23[0xe].m_context = (Context *)&queueFamilyIndex;
  *(undefined4 *)&pTVar23[0xf]._vptr_TestInstance = 0;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams,vk,device,
                    (VkImageCreateInfo *)(pTVar23 + 10),(VkAllocationCallbacks *)0x0);
  pVVar14 = renderPassParams.pAttachments;
  uVar13 = renderPassParams._16_8_;
  pvVar12 = renderPassParams.pNext;
  uVar11 = renderPassParams._0_8_;
  local_528._M_allocated_capacity._0_4_ = renderPassParams.flags;
  local_528._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
  local_528._8_8_ = renderPassParams.pAttachments;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  if (*ppCVar35 == (Context *)0x0) {
    pTVar23[0x10].m_context = (Context *)uVar13;
    pTVar23[0x11]._vptr_TestInstance = (_func_int **)pVVar14;
    *ppCVar35 = (Context *)uVar11;
    pTVar23[0x10]._vptr_TestInstance = (_func_int **)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(pTVar23 + 0x10),(VkImage)*ppCVar35);
    pTVar23[0x10].m_context = (Context *)local_528._M_allocated_capacity;
    pTVar23[0x11]._vptr_TestInstance = (_func_int **)local_528._8_8_;
    *ppCVar35 = (Context *)formatProps._0_8_;
    pTVar23[0x10]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&renderPassParams.pNext,
                 (VkImage)renderPassParams._0_8_);
    }
  }
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&formatProps,vk,device,(VkImage)*ppCVar35);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&renderPassParams,
             &memAlloc,(VkMemoryRequirements *)&formatProps,(MemoryRequirement)0x0);
  uVar11 = renderPassParams._0_8_;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  pCVar33 = pTVar23[0x11].m_context;
  if (pCVar33 != (Context *)uVar11) {
    if (pCVar33 == (Context *)0x0) {
      pTVar23[0x11].m_context = (Context *)uVar11;
      pCVar33 = (Context *)uVar11;
    }
    else {
      (*(code *)pCVar33->m_testCtx->m_rootArchive)();
      pTVar23[0x11].m_context = (Context *)uVar11;
      pCVar33 = (Context *)uVar11;
      if (renderPassParams._0_8_ != 0) {
        (**(code **)(*(long *)renderPassParams._0_8_ + 8))();
        pCVar33 = pTVar23[0x11].m_context;
      }
    }
  }
  VVar22 = (*vk->_vptr_DeviceInterface[0xd])(vk,device,*ppCVar35,pCVar33->m_platformInterface);
  ::vk::checkResult(VVar22,
                    "vk.bindImageMemory(vkDevice, *m_colorImage, m_colorImageAlloc->getMemory(), m_colorImageAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x153);
  formatProps.linearTilingFeatures = 0xf;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = local_528._M_allocated_capacity & 0xffffffff00000000;
  local_528._8_8_ = pTVar23[0xf].m_context;
  local_518._0_4_ = 1.4013e-45;
  local_518._4_4_ = *(float *)&pTVar23[9].m_context;
  pCStack_510 = (Context *)0x0;
  uStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  uStack_500 = (VkPipelineViewportStateCreateInfo *)&DAT_00000001;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
  local_4f0 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_4f0._4_4_,1);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)shaderStages,vk,device,
             (VkImageViewCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  VVar15 = shaderStages[0].module;
  uVar13 = shaderStages[0]._16_8_;
  pvVar12 = shaderStages[0].pNext;
  uVar11 = shaderStages[0]._0_8_;
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  if (*__s == (Context *)0x0) {
    pTVar23[0x13].m_context = (Context *)uVar13;
    pTVar23[0x14]._vptr_TestInstance = (_func_int **)VVar15.m_internal;
    *__s = (Context *)uVar11;
    pTVar23[0x13]._vptr_TestInstance = (_func_int **)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(pTVar23 + 0x13),(VkImageView)*__s);
    pTVar23[0x13].m_context = (Context *)renderPassParams._16_8_;
    pTVar23[0x14]._vptr_TestInstance = (_func_int **)renderPassParams.pAttachments;
    *__s = (Context *)renderPassParams._0_8_;
    pTVar23[0x13]._vptr_TestInstance = (_func_int **)renderPassParams.pNext;
    if (shaderStages[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&shaderStages[0].pNext,
                 (VkImageView)shaderStages[0]._0_8_);
    }
  }
  shaderStages[0]._0_8_ = (ulong)*(uint *)&pTVar23[9].m_context << 0x20;
  shaderStages[0].pNext = (void *)0x100000001;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
  shaderStages[0].module.m_internal = 0x200000001;
  shaderStages[0].pName = (char *)CONCAT44(shaderStages[0].pName._4_4_,2);
  local_518 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
  local_5c0 = colorAttachmentReference;
  colorAttachmentReference.attachment = 0;
  colorAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_528._M_allocated_capacity = 0;
  pCStack_510 = (Context *)0x0;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  uStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  uStack_500 = (VkPipelineViewportStateCreateInfo *)0x0;
  formatProps.linearTilingFeatures = 0;
  formatProps.optimalTilingFeatures = 0;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._8_8_ = 1;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 1;
  renderPassParams.subpassCount = 1;
  renderPassParams._48_8_ = (ulong)(uint)renderPassParams._52_4_ << 0x20;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages;
  renderPassParams.pSubpasses = (VkSubpassDescription *)&formatProps;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_638,vk,device,&renderPassParams,
             (VkAllocationCallbacks *)0x0);
  ppCVar35 = local_5f0;
  VVar17.m_internal = VStack_620.m_internal;
  pVVar16 = local_628;
  uVar13 = local_638._8_8_;
  uVar11 = local_638._0_8_;
  rasterStateParams._16_8_ = local_628;
  rasterStateParams.rasterizerDiscardEnable = (VkLogicOp)VStack_620.m_internal;
  rasterStateParams.polygonMode = VStack_620.m_internal._4_4_;
  rasterStateParams._0_8_ = local_638._0_8_;
  rasterStateParams.pNext = (void *)local_638._8_8_;
  local_638._0_8_ = 0;
  local_638._8_8_ = (DeviceInterface *)0x0;
  local_628 = (VkDevice)0x0;
  VStack_620.m_internal = 0;
  if (*local_5f0 == (Context *)0x0) {
    local_5f0[2] = (Context *)pVVar16;
    local_5f0[3] = (Context *)VVar17.m_internal;
    *local_5f0 = (Context *)uVar11;
    local_5f0[1] = (Context *)uVar13;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(pTVar23 + 0x15),(VkRenderPass)*local_5f0
              );
    ppCVar35[2] = (Context *)rasterStateParams._16_8_;
    ppCVar35[3] = (Context *)rasterStateParams._24_8_;
    *ppCVar35 = (Context *)rasterStateParams._0_8_;
    ppCVar35[1] = (Context *)rasterStateParams.pNext;
    if (local_638._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(local_638 + 8),
                 (VkRenderPass)local_638._0_8_);
    }
  }
  ppCVar35 = local_5f8;
  formatProps.linearTilingFeatures = 0x25;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = local_528._M_allocated_capacity & 0xffffffff00000000;
  local_528._8_8_ = pTVar23[0x14].m_context;
  local_518._0_4_ = 1.4013e-45;
  uStack_508 = (VkPipelineTessellationStateCreateInfo *)pTVar23[9]._vptr_TestInstance;
  uStack_500 = (VkPipelineViewportStateCreateInfo *)CONCAT44(uStack_500._4_4_,1);
  pCStack_510 = (Context *)__s;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)shaderStages,vk,device,
             (VkFramebufferCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  VVar15 = shaderStages[0].module;
  uVar13 = shaderStages[0]._16_8_;
  pvVar12 = shaderStages[0].pNext;
  uVar11 = shaderStages[0]._0_8_;
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  if (*ppCVar35 == (Context *)0x0) {
    ppCVar35[2] = (Context *)uVar13;
    ppCVar35[3] = (Context *)VVar15.m_internal;
    *ppCVar35 = (Context *)uVar11;
    ppCVar35[1] = (Context *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(pTVar23 + 0x17),(VkFramebuffer)*ppCVar35
              );
    ppCVar35[2] = (Context *)renderPassParams._16_8_;
    ppCVar35[3] = (Context *)renderPassParams.pAttachments;
    *ppCVar35 = (Context *)renderPassParams._0_8_;
    ppCVar35[1] = (Context *)renderPassParams.pNext;
    if (shaderStages[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&shaderStages[0].pNext,
                 (VkFramebuffer)shaderStages[0]._0_8_);
    }
  }
  ppCVar35 = local_600;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_518._0_4_ = 0.0;
  local_518._4_4_ = 0.0;
  pCStack_510 = (Context *)0x0;
  local_528._M_allocated_capacity = 0;
  local_528._8_8_ = 0;
  formatProps.linearTilingFeatures = 0x1e;
  formatProps.optimalTilingFeatures = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)shaderStages,vk,device,
             (VkPipelineLayoutCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
  VVar15 = shaderStages[0].module;
  uVar13 = shaderStages[0]._16_8_;
  pvVar12 = shaderStages[0].pNext;
  uVar11 = shaderStages[0]._0_8_;
  renderPassParams.flags = shaderStages[0].flags;
  renderPassParams.attachmentCount = shaderStages[0].stage;
  renderPassParams.pAttachments = (VkAttachmentDescription *)shaderStages[0].module.m_internal;
  renderPassParams.sType = shaderStages[0].sType;
  renderPassParams._4_4_ = shaderStages[0]._4_4_;
  renderPassParams.pNext = shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  if (pTVar3->_vptr_TestInstance == (_func_int **)0x0) {
    pTVar23[0x22]._vptr_TestInstance = (_func_int **)uVar13;
    pTVar23[0x22].m_context = (Context *)VVar15.m_internal;
    pTVar3->_vptr_TestInstance = (_func_int **)uVar11;
    pTVar23[0x21].m_context = (Context *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&pTVar23[0x21].m_context,
               (VkPipelineLayout)pTVar3->_vptr_TestInstance);
    pTVar23[0x22]._vptr_TestInstance = (_func_int **)renderPassParams._16_8_;
    pTVar23[0x22].m_context = (Context *)renderPassParams.pAttachments;
    pTVar3->_vptr_TestInstance = (_func_int **)renderPassParams._0_8_;
    pTVar23[0x21].m_context = (Context *)renderPassParams.pNext;
    if (shaderStages[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&shaderStages[0].pNext,
                 (VkPipelineLayout)shaderStages[0]._0_8_);
    }
  }
  pVVar8 = &shaderStages[0].flags;
  shaderStages[0].flags = 0x6f6c6f63;
  shaderStages[0].stage = 0x65765f72;
  shaderStages[0].pNext = (void *)0xa;
  shaderStages[0].module.m_internal._0_3_ = 0x7472;
  shaderStages[0]._0_8_ = pVVar8;
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)pTVar23->m_context->m_progCollection,(key_type *)shaderStages);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,
             *(ProgramBinary **)(cVar26._M_node + 2),0);
  pVVar14 = renderPassParams.pAttachments;
  uVar13 = renderPassParams._16_8_;
  pvVar12 = renderPassParams.pNext;
  uVar11 = renderPassParams._0_8_;
  local_528._M_allocated_capacity._0_4_ = renderPassParams.flags;
  local_528._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
  local_528._8_8_ = renderPassParams.pAttachments;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  if (*ppCVar35 == (Context *)0x0) {
    ppCVar35[2] = (Context *)uVar13;
    ppCVar35[3] = (Context *)pVVar14;
    *ppCVar35 = (Context *)uVar11;
    ppCVar35[1] = (Context *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(pTVar23 + 0x19),
               (VkShaderModule)*ppCVar35);
    ppCVar35[2] = (Context *)local_528._M_allocated_capacity;
    ppCVar35[3] = (Context *)local_528._8_8_;
    *ppCVar35 = (Context *)formatProps._0_8_;
    ppCVar35[1] = stack0xfffffffffffffad0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams.pNext,
                 (VkShaderModule)renderPassParams._0_8_);
    }
  }
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  if ((VkPipelineShaderStageCreateFlags *)shaderStages[0]._0_8_ != pVVar8) {
    operator_delete((void *)shaderStages[0]._0_8_,shaderStages[0]._16_8_ + 1);
  }
  shaderStages[0].flags = 0x6f6c6f63;
  shaderStages[0].stage = 0x72665f72;
  shaderStages[0].pNext = (void *)0xa;
  shaderStages[0].module.m_internal._0_3_ = 0x6761;
  shaderStages[0]._0_8_ = pVVar8;
  cVar26 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)pTVar23->m_context->m_progCollection,(key_type *)shaderStages);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams,vk,device,
             *(ProgramBinary **)(cVar26._M_node + 2),0);
  pVVar14 = renderPassParams.pAttachments;
  uVar13 = renderPassParams._16_8_;
  pvVar12 = renderPassParams.pNext;
  uVar11 = renderPassParams._0_8_;
  local_528._M_allocated_capacity._0_4_ = renderPassParams.flags;
  local_528._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
  local_528._8_8_ = renderPassParams.pAttachments;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  if (*ppCVar1 == (Context *)0x0) {
    pTVar23[0x1b].m_context = (Context *)uVar13;
    pTVar23[0x1c]._vptr_TestInstance = (_func_int **)pVVar14;
    *ppCVar1 = (Context *)uVar11;
    pTVar23[0x1b]._vptr_TestInstance = (_func_int **)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(pTVar23 + 0x1b),(VkShaderModule)*ppCVar1
              );
    pTVar23[0x1b].m_context = (Context *)local_528._M_allocated_capacity;
    pTVar23[0x1c]._vptr_TestInstance = (_func_int **)local_528._8_8_;
    *ppCVar1 = (Context *)formatProps._0_8_;
    pTVar23[0x1b]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&renderPassParams.pNext,
                 (VkShaderModule)renderPassParams._0_8_);
    }
  }
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  if ((VkPipelineShaderStageCreateFlags *)shaderStages[0]._0_8_ != pVVar8) {
    operator_delete((void *)shaderStages[0]._0_8_,shaderStages[0]._16_8_ + 1);
  }
  shaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStages[0].module.m_internal = (deUint64)pTVar23[0x18].m_context;
  shaderStages[0].pName = "main";
  shaderStages[0].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  shaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStages[1].pNext = (void *)0x0;
  shaderStages[1].flags = 0;
  shaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStages[1].module.m_internal = (deUint64)pTVar23[0x1a].m_context;
  shaderStages[1].pName = "main";
  shaderStages[1].pSpecializationInfo = (VkSpecializationInfo *)0x0;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x20;
  colorAttachmentReference.attachment = 0x13;
  local_5c0 = (VkAttachmentReference)0x0;
  pCStack_510 = (Context *)&inputAssemblyStateParams;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  inputAssemblyStateParams._28_4_ = 0;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams.pNext = (void *)0x0;
  viewportStateParams.pViewports = &local_2e0;
  local_2e0.x = 0.0;
  local_2e0.y = 0.0;
  scissor.extent.width = *(deUint32 *)&pTVar23[9]._vptr_TestInstance;
  local_2e0.width = (float)scissor.extent.width;
  scissor.extent.height = *(uint *)((long)&pTVar23[9]._vptr_TestInstance + 4);
  local_2e0.height = (float)scissor.extent.height;
  local_2e0.minDepth = 0.0;
  local_2e0.maxDepth = 1.0;
  viewportStateParams.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  uStack_500 = &viewportStateParams;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.pNext = (void *)0x0;
  viewportStateParams.flags = 0;
  viewportStateParams.viewportCount = 1;
  viewportStateParams.scissorCount = 1;
  pVStack_4f8 = &rasterStateParams;
  rasterStateParams.pNext = (void *)0x0;
  rasterStateParams.depthBiasClamp = 0.0;
  rasterStateParams.depthBiasSlopeFactor = 0.0;
  rasterStateParams.cullMode = 0;
  rasterStateParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterStateParams.depthBiasEnable = 0;
  rasterStateParams.depthBiasConstantFactor = 0.0;
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.lineWidth = 1.0;
  rasterStateParams._60_4_ = 0;
  local_4f0 = &multisampleStateParams;
  multisampleStateParams.pNext = (void *)0x0;
  multisampleStateParams.sampleShadingEnable = 0;
  multisampleStateParams.minSampleShading = 0.0;
  multisampleStateParams.pSampleMask = (VkSampleMask *)0x0;
  multisampleStateParams.alphaToCoverageEnable = 0;
  multisampleStateParams.alphaToOneEnable = 0;
  multisampleStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleStateParams._4_4_ = 0;
  multisampleStateParams.flags = 0;
  multisampleStateParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams._52_4_ = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  renderPassParams.subpassCount = 0;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses = (VkSubpassDescription *)0x0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x100000000;
  local_638._0_4_ = 0x1a;
  local_638._8_8_ = (Context *)0x0;
  local_628 = (VkDevice)0x0;
  VStack_620.m_internal = 3;
  local_610[0] = 0.1;
  local_610[1] = 0.2;
  local_610[2] = 0.3;
  local_610[3] = 0.4;
  formatProps.linearTilingFeatures = 0x1c;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = 0x200000000;
  local_518 = (VkPipelineVertexInputStateCreateInfo *)&colorAttachmentReference;
  uStack_508 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_4e0 = (VkPipelineColorBlendStateCreateInfo *)local_638;
  local_4d8 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_4d0.m_internal = (deUint64)pTVar23[0x21]._vptr_TestInstance;
  local_4c8.m_internal = (deUint64)pTVar23[0x14].m_context;
  local_4c0 = 0;
  local_4b8.m_internal = 0;
  local_4b0 = 0;
  pTVar3 = pTVar23 + 0x23;
  lVar28 = 4;
  local_528._8_8_ = shaderStages;
  local_4e8 = (VkPipelineDepthStencilStateCreateInfo *)&renderPassParams;
  do {
    ppCVar35 = &pTVar3->m_context;
    VStack_620.m_internal._4_4_ = 1;
    local_618 = (VkPipelineColorBlendAttachmentState *)(ppCVar35 + -0x45);
    ::vk::createGraphicsPipeline
              (&local_5e8,vk,device,(VkPipelineCache)0x0,
               (VkGraphicsPipelineCreateInfo *)&formatProps,(VkAllocationCallbacks *)0x0);
    pVVar20 = local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    pVVar16 = local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    pDVar19 = local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    HVar18.m_internal =
         local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
    local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    if (((TestInstance *)(ppCVar35 + -1))->_vptr_TestInstance == (_func_int **)0x0) {
      ppCVar35[1] = (Context *)pVVar16;
      ppCVar35[2] = (Context *)pVVar20;
      ((TestInstance *)(ppCVar35 + -1))->_vptr_TestInstance = (_func_int **)HVar18.m_internal;
      *ppCVar35 = (Context *)pDVar19;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)18>_> *)ppCVar35,
                 (VkPipeline)((TestInstance *)(ppCVar35 + -1))->_vptr_TestInstance);
      ppCVar35[1] = (Context *)pVVar16;
      ppCVar35[2] = (Context *)pVVar20;
      ((TestInstance *)(ppCVar35 + -1))->_vptr_TestInstance = (_func_int **)HVar18.m_internal;
      *ppCVar35 = (Context *)pDVar19;
      if (local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                   (VkPipeline)
                   local_5e8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
                  );
      }
    }
    pTVar3 = (TestInstance *)(ppCVar35 + 3);
    lVar28 = lVar28 + -1;
  } while (lVar28 != 0);
  renderPassParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams._16_8_ = renderPassParams._16_8_ & 0xffffffff00000000;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x400;
  renderPassParams.subpassCount = 0x80;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses =
       (VkSubpassDescription *)CONCAT44(renderPassParams.pSubpasses._4_4_,1);
  renderPassParams._48_8_ = &queueFamilyIndex;
  createOverlappingQuads();
  pCVar33 = pTVar23[0x1e].m_context;
  pCVar31 = pTVar23[0x1f].m_context;
  pTVar23[0x1e].m_context = (Context *)formatProps._0_8_;
  pTVar23[0x1f]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
  pTVar23[0x1f].m_context = (Context *)local_528._M_allocated_capacity;
  formatProps.linearTilingFeatures = 0;
  formatProps.optimalTilingFeatures = 0;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = 0;
  if (pCVar33 != (Context *)0x0) {
    operator_delete(pCVar33,(long)pCVar31 - (long)pCVar33);
    if (formatProps._0_8_ != 0) {
      operator_delete((void *)formatProps._0_8_,local_528._M_allocated_capacity - formatProps._0_8_)
      ;
    }
  }
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)shaderStages,vk,device,
                     (VkBufferCreateInfo *)&renderPassParams,(VkAllocationCallbacks *)0x0);
  VVar15 = shaderStages[0].module;
  uVar13 = shaderStages[0]._16_8_;
  pvVar12 = shaderStages[0].pNext;
  uVar11 = shaderStages[0]._0_8_;
  local_528._M_allocated_capacity._0_4_ = shaderStages[0].flags;
  local_528._M_allocated_capacity._4_4_ = shaderStages[0].stage;
  local_528._8_8_ = shaderStages[0].module.m_internal;
  formatProps.linearTilingFeatures = shaderStages[0].sType;
  formatProps.optimalTilingFeatures = shaderStages[0]._4_4_;
  stack0xfffffffffffffad0 = (Context *)shaderStages[0].pNext;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext = (void *)0x0;
  shaderStages[0].flags = 0;
  shaderStages[0].stage = 0;
  shaderStages[0].module.m_internal = 0;
  if (*ppCVar2 == (Context *)0x0) {
    pTVar23[0x1d].m_context = (Context *)uVar13;
    pTVar23[0x1e]._vptr_TestInstance = (_func_int **)VVar15.m_internal;
    *ppCVar2 = (Context *)uVar11;
    pTVar23[0x1d]._vptr_TestInstance = (_func_int **)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(pTVar23 + 0x1d),(VkBuffer)*ppCVar2);
    pTVar23[0x1d].m_context = (Context *)local_528._M_allocated_capacity;
    pTVar23[0x1e]._vptr_TestInstance = (_func_int **)local_528._8_8_;
    *ppCVar2 = (Context *)formatProps._0_8_;
    pTVar23[0x1d]._vptr_TestInstance = (_func_int **)stack0xfffffffffffffad0;
    if (shaderStages[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&shaderStages[0].pNext,
                 (VkBuffer)shaderStages[0]._0_8_);
    }
  }
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&formatProps,vk,device,(VkBuffer)*ppCVar2);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)shaderStages,&memAlloc,
             (VkMemoryRequirements *)&formatProps,(MemoryRequirement)0x1);
  uVar11 = shaderStages[0]._0_8_;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  pp_Var37 = pTVar23[0x20]._vptr_TestInstance;
  if (pp_Var37 != (_func_int **)uVar11) {
    if (pp_Var37 == (_func_int **)0x0) {
      pTVar23[0x20]._vptr_TestInstance = (_func_int **)uVar11;
      pp_Var37 = (_func_int **)uVar11;
    }
    else {
      (**(code **)(*pp_Var37 + 8))();
      pTVar23[0x20]._vptr_TestInstance = (_func_int **)uVar11;
      pp_Var37 = (_func_int **)uVar11;
      if (shaderStages[0]._0_8_ != 0) {
        (**(code **)(*(long *)shaderStages[0]._0_8_ + 8))();
        pp_Var37 = pTVar23[0x20]._vptr_TestInstance;
      }
    }
  }
  VVar22 = (*vk->_vptr_DeviceInterface[0xc])(vk,device,*ppCVar2,pp_Var37[1],pp_Var37[2]);
  ::vk::checkResult(VVar22,
                    "vk.bindBufferMemory(vkDevice, *m_vertexBuffer, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x29c);
  bVar21 = ::vk::isFloatFormat(*(VkFormat *)&pTVar23[9].m_context);
  if (bVar21) {
    pCVar33 = pTVar23[0x1e].m_context;
    pCVar31 = (Context *)pTVar23[0x1f]._vptr_TestInstance;
  }
  else {
    shaderStages[0]._0_8_ = ::vk::mapVkFormat(*(VkFormat *)&pTVar23[9].m_context);
    tcu::getTextureFormatInfo((TextureFormatInfo *)&formatProps,(TextureFormat *)shaderStages);
    pCVar33 = pTVar23[0x1e].m_context;
    pCVar31 = (Context *)pTVar23[0x1f]._vptr_TestInstance;
    if (pCVar31 != pCVar33) {
      lVar28 = 0x10;
      uVar29 = 0;
      do {
        pfVar7 = (float *)((long)&pCVar33->m_testCtx + lVar28);
        auVar40._8_8_ = pCStack_510;
        auVar40._0_8_ = local_518;
        auVar39._0_4_ = *pfVar7 - (float)uStack_508;
        auVar39._4_4_ = pfVar7[1] - uStack_508._4_4_;
        auVar39._8_4_ = pfVar7[2] - (float)uStack_500;
        auVar39._12_4_ = pfVar7[3] - uStack_500._4_4_;
        auVar40 = divps(auVar39,auVar40);
        *(undefined1 (*) [16])((long)&pCVar33->m_testCtx + lVar28) = auVar40;
        uVar29 = uVar29 + 1;
        pCVar33 = pTVar23[0x1e].m_context;
        pCVar31 = (Context *)pTVar23[0x1f]._vptr_TestInstance;
        lVar28 = lVar28 + 0x20;
      } while (uVar29 < (ulong)((long)pCVar31 - (long)pCVar33 >> 5));
    }
  }
  memcpy(pTVar23[0x20]._vptr_TestInstance[3],pCVar33,(long)pCVar31 - (long)pCVar33);
  formatProps.linearTilingFeatures = 6;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = (size_type)pTVar23[0x20]._vptr_TestInstance[1];
  local_528._8_8_ = pTVar23[0x20]._vptr_TestInstance[2];
  local_518._0_4_ = SUB84(renderPassParams.pAttachments,0);
  local_518._4_4_ = (float)((ulong)renderPassParams.pAttachments >> 0x20);
  (*vk->_vptr_DeviceInterface[9])(vk,device,1,&formatProps);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams,vk,device,1,queueFamilyIndex
             ,(VkAllocationCallbacks *)0x0);
  pVVar14 = renderPassParams.pAttachments;
  uVar13 = renderPassParams._16_8_;
  pvVar12 = renderPassParams.pNext;
  uVar11 = renderPassParams._0_8_;
  local_528._M_allocated_capacity._0_4_ = renderPassParams.flags;
  local_528._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
  local_528._8_8_ = renderPassParams.pAttachments;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  if (pTVar4->_vptr_TestInstance == (_func_int **)0x0) {
    pTVar23[0x2c]._vptr_TestInstance = (_func_int **)uVar13;
    pTVar23[0x2c].m_context = (Context *)pVVar14;
    pTVar4->_vptr_TestInstance = (_func_int **)uVar11;
    pTVar23[0x2b].m_context = (Context *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&pTVar23[0x2b].m_context,
               (VkCommandPool)pTVar4->_vptr_TestInstance);
    pTVar23[0x2c]._vptr_TestInstance = (_func_int **)local_528._M_allocated_capacity;
    pTVar23[0x2c].m_context = (Context *)local_528._8_8_;
    pTVar4->_vptr_TestInstance = (_func_int **)formatProps._0_8_;
    pTVar23[0x2b].m_context = stack0xfffffffffffffad0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&renderPassParams.pNext,
                 (VkCommandPool)renderPassParams._0_8_);
    }
  }
  rasterStateParams.flags = 0;
  rasterStateParams.depthClampEnable = 0;
  rasterStateParams.rasterizerDiscardEnable = 0;
  rasterStateParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterStateParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  rasterStateParams._4_4_ = 0;
  rasterStateParams.pNext = (void *)0x0;
  _colorAttachmentReference = defaultClearValue(*(VkFormat *)&pTVar23[9].m_context);
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams._16_8_ = pTVar23[0x14].m_context;
  renderPassParams.pAttachments = (VkAttachmentDescription *)pTVar23[0x16].m_context;
  renderPassParams.subpassCount = 0;
  renderPassParams._36_4_ = 0;
  renderPassParams.pSubpasses = (VkSubpassDescription *)pTVar23[9]._vptr_TestInstance;
  renderPassParams.dependencyCount = 1;
  renderPassParams.pDependencies = (VkSubpassDependency *)&colorAttachmentReference;
  formatProps.linearTilingFeatures = 0x2d;
  stack0xfffffffffffffad0 = (Context *)0x0;
  local_528._M_allocated_capacity = 0x10000000000;
  local_528._8_8_ = 0x200000000;
  local_518._0_4_ = -NAN;
  local_518._4_4_ = -NAN;
  pCStack_510 = pTVar23[0xf].m_context;
  uStack_508 = (VkPipelineTessellationStateCreateInfo *)&DAT_00000001;
  uStack_500 = (VkPipelineViewportStateCreateInfo *)&DAT_00000001;
  pVStack_4f8 = (VkPipelineRasterizationStateCreateInfo *)CONCAT44(pVStack_4f8._4_4_,1);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_638,vk,device,
             (VkCommandPool)pTVar23[0x2b]._vptr_TestInstance,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar17.m_internal = VStack_620.m_internal;
  pVVar16 = local_628;
  uVar13 = local_638._8_8_;
  uVar11 = local_638._0_8_;
  shaderStages[0]._16_8_ = local_628;
  shaderStages[0].module.m_internal = VStack_620.m_internal;
  shaderStages[0]._0_8_ = local_638._0_8_;
  shaderStages[0].pNext = (void *)local_638._8_8_;
  local_638._0_8_ = 0;
  local_638._8_8_ = (DeviceInterface *)0x0;
  local_628 = (VkDevice)0x0;
  VStack_620.m_internal = 0;
  if (pTVar5->_vptr_TestInstance == (_func_int **)0x0) {
    pTVar23[0x2e]._vptr_TestInstance = (_func_int **)pVVar16;
    pTVar23[0x2e].m_context = (Context *)VVar17.m_internal;
    pTVar5->_vptr_TestInstance = (_func_int **)uVar11;
    pTVar23[0x2d].m_context = (Context *)uVar13;
  }
  else {
    viewportStateParams._0_8_ = pTVar5->_vptr_TestInstance;
    (*(code *)(pTVar23[0x2d].m_context)->m_testCtx[6].m_platform)
              (pTVar23[0x2d].m_context,pTVar23[0x2e]._vptr_TestInstance,pTVar23[0x2e].m_context,1);
    *(VkPipelineShaderStageCreateFlags *)&pTVar23[0x2e]._vptr_TestInstance = shaderStages[0].flags;
    *(VkShaderStageFlagBits *)((long)&pTVar23[0x2e]._vptr_TestInstance + 4) = shaderStages[0].stage;
    *(undefined4 *)&pTVar23[0x2e].m_context = (undefined4)shaderStages[0].module.m_internal;
    *(undefined4 *)((long)&pTVar23[0x2e].m_context + 4) = shaderStages[0].module.m_internal._4_4_;
    pTVar5->_vptr_TestInstance = (_func_int **)shaderStages[0]._0_8_;
    pTVar23[0x2d].m_context = (Context *)shaderStages[0].pNext;
    if (local_638._0_8_ != 0) {
      shaderStages[0]._0_8_ = local_638._0_8_;
      (*(*(_func_int ***)local_638._8_8_)[0x48])(local_638._8_8_,local_628,VStack_620.m_internal,1);
    }
  }
  VVar22 = (*vk->_vptr_DeviceInterface[0x49])(vk,pTVar5->_vptr_TestInstance,&rasterStateParams);
  ::vk::checkResult(VVar22,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x2e0);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,pTVar5->_vptr_TestInstance,1,0x80,0,0,0,0,0,1,&formatProps);
  (*vk->_vptr_DeviceInterface[0x74])(vk,pTVar5->_vptr_TestInstance,&renderPassParams,0);
  pp_Var37 = pTVar23[0x1f]._vptr_TestInstance;
  pCVar33 = pTVar23[0x1e].m_context;
  lVar28 = 0x230;
  lVar36 = 0;
  do {
    shaderStages[0]._0_8_ = lVar36;
    (*vk->_vptr_DeviceInterface[0x4c])
              (vk,pTVar23[0x2d]._vptr_TestInstance,0,
               *(undefined8 *)((long)&pTVar23->_vptr_TestInstance + lVar28));
    (*vk->_vptr_DeviceInterface[0x58])(vk,pTVar5->_vptr_TestInstance,0,1,ppCVar2,shaderStages);
    (*vk->_vptr_DeviceInterface[0x59])
              (vk,pTVar23[0x2d]._vptr_TestInstance,
               (ulong)((long)pTVar23[0x1f]._vptr_TestInstance - (long)pTVar23[0x1e].m_context) >> 7,
               1,0,0);
    lVar28 = lVar28 + 0x20;
    lVar36 = lVar36 + ((long)pp_Var37 - (long)pCVar33 >> 2 & 0xffffffffffffffe0U);
  } while (lVar28 != 0x2b0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,pTVar5->_vptr_TestInstance);
  VVar22 = (*vk->_vptr_DeviceInterface[0x4a])(vk,pTVar5->_vptr_TestInstance);
  ::vk::checkResult(VVar22,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineBlendTests.cpp"
                    ,0x2f3);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  pVVar14 = renderPassParams.pAttachments;
  uVar13 = renderPassParams._16_8_;
  pvVar12 = renderPassParams.pNext;
  uVar11 = renderPassParams._0_8_;
  local_528._M_allocated_capacity._0_4_ = renderPassParams.flags;
  local_528._M_allocated_capacity._4_4_ = renderPassParams.attachmentCount;
  local_528._8_8_ = renderPassParams.pAttachments;
  formatProps.linearTilingFeatures = renderPassParams.sType;
  formatProps.optimalTilingFeatures = renderPassParams._4_4_;
  stack0xfffffffffffffad0 = (Context *)renderPassParams.pNext;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 0;
  renderPassParams.pAttachments = (VkAttachmentDescription *)0x0;
  if (pTVar6->_vptr_TestInstance == (_func_int **)0x0) {
    pTVar23[0x30]._vptr_TestInstance = (_func_int **)uVar13;
    pTVar23[0x30].m_context = (Context *)pVVar14;
    pTVar6->_vptr_TestInstance = (_func_int **)uVar11;
    pTVar23[0x2f].m_context = (Context *)pvVar12;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&pTVar23[0x2f].m_context,
               (VkFence)pTVar6->_vptr_TestInstance);
    pTVar23[0x30]._vptr_TestInstance = (_func_int **)local_528._M_allocated_capacity;
    pTVar23[0x30].m_context = (Context *)local_528._8_8_;
    pTVar6->_vptr_TestInstance = (_func_int **)formatProps._0_8_;
    pTVar23[0x2f].m_context = stack0xfffffffffffffad0;
    if (renderPassParams._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&renderPassParams.pNext,
                 (VkFence)renderPassParams._0_8_);
    }
  }
  return pTVar23;
}

Assistant:

TestInstance* BlendTest::createInstance(Context& context) const
{
	return new BlendTestInstance(context, m_colorFormat, m_blendStates);
}